

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  void *pvVar4;
  ImGuiColumns *pIVar5;
  Pair *pPVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (this->DrawList != &this->DrawListInst) {
    __assert_fail("DrawList == &DrawListInst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xa27,"ImGuiWindow::~ImGuiWindow()");
  }
  pcVar3 = this->Name;
  if (pcVar3 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
  }
  uVar2 = (this->ColumnsStorage).Size;
  uVar8 = (ulong)uVar2;
  if (uVar2 != 0) {
    lVar10 = 0x38;
    uVar9 = 0;
    do {
      if ((long)(int)uVar8 <= (long)uVar9) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImGuiColumns>::operator[](int) [T = ImGuiColumns]");
      }
      pvVar4 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar10);
      if (pvVar4 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar4,GImAllocatorUserData);
      }
      uVar9 = uVar9 + 1;
      uVar8 = (ulong)(uint)(this->ColumnsStorage).Size;
      lVar10 = lVar10 + 0x40;
    } while (uVar9 != uVar8);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar5 = (this->ColumnsStorage).Data;
  if (pIVar5 != (ImGuiColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  pPVar6 = (this->StateStorage).Data.Data;
  if (pPVar6 != (Pair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pPVar6,GImAllocatorUserData);
  }
  puVar7 = (this->IDStack).Data;
  if (puVar7 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
  }
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}